

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O2

GLuint __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::prepareProgram
          (FunctionalTest *this,GLenum target,TextureInternalFormatDescriptor descriptor,
          ColorChannelSelector channel)

{
  int iVar1;
  GLuint GVar2;
  undefined4 extraout_var;
  string *psVar3;
  undefined4 *puVar4;
  GLint i;
  GLint i_00;
  allocator<char> local_2a9;
  string component_name;
  string texel_fetch_arguments_tail;
  string sampler_name;
  string local_248;
  string fragment_shader;
  string type_name;
  string sampler_prefix;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string template_verison;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sampler_name,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&texel_fetch_arguments_tail);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texel_fetch_arguments_tail,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&component_name);
  if (target == 0xde0) {
    std::__cxx11::string::assign((char *)&sampler_name);
LAB_009233a4:
    std::__cxx11::string::assign((char *)&texel_fetch_arguments_tail);
  }
  else {
    if (target == 0xde1) {
LAB_00923393:
      std::__cxx11::string::assign((char *)&sampler_name);
      goto LAB_009233a4;
    }
    if (target == 0x806f) {
LAB_00923379:
      std::__cxx11::string::assign((char *)&sampler_name);
      goto LAB_009233a4;
    }
    if (target == 0x84f5) {
      std::__cxx11::string::assign((char *)&sampler_name);
      goto LAB_009233a4;
    }
    if (target == 0x8c18) goto LAB_00923393;
    if (target == 0x8c1a) goto LAB_00923379;
    if (target == 0x9100) {
      std::__cxx11::string::assign((char *)&sampler_name);
      std::__cxx11::string::assign((char *)&texel_fetch_arguments_tail);
      Utilities::itoa_abi_cxx11_(&component_name,(Utilities *)(ulong)(this->m_max_samples - 1),i_00)
      ;
      std::__cxx11::string::append((string *)&texel_fetch_arguments_tail);
    }
    else {
      if (target != 0x9102) {
        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar4 = 0;
        __cxa_throw(puVar4,&int::typeinfo,0);
      }
      std::__cxx11::string::assign((char *)&sampler_name);
      std::__cxx11::string::assign((char *)&texel_fetch_arguments_tail);
      Utilities::itoa_abi_cxx11_(&component_name,(Utilities *)(ulong)(this->m_max_samples - 1),i);
      std::__cxx11::string::append((string *)&texel_fetch_arguments_tail);
    }
    std::__cxx11::string::~string((string *)&component_name);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&component_name,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&type_name);
  switch(channel) {
  case RED_COMPONENT:
    break;
  case GREEN_COMPONENT:
    break;
  case BLUE_COMPONENT:
    break;
  case ALPHA_COMPONENT:
    break;
  case COMPONENTS_COUNT:
    goto switchD_009233e0_caseD_4;
  default:
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&int::typeinfo,0);
  }
  std::__cxx11::string::assign((char *)&component_name);
switchD_009233e0_caseD_4:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type_name,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&sampler_prefix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sampler_prefix,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&template_verison);
  if ((((((descriptor.expected_alpha_type == 0x1406 || descriptor.expected_blue_type == 0x1406) ||
          (descriptor.expected_green_type == 0x1406 || descriptor.expected_red_type == 0x1406)) ||
        ((descriptor.expected_alpha_type == 0x8f9c || descriptor.expected_blue_type == 0x8f9c) ||
         (descriptor.expected_green_type == 0x8f9c || descriptor.expected_red_type == 0x8f9c))) ||
       (descriptor.expected_red_type == 0x8c17)) ||
      ((descriptor.expected_green_type == 0x8c17 || (descriptor.expected_blue_type == 0x8c17)))) ||
     ((descriptor.expected_alpha_type == 0x8c17 ||
      ((descriptor.expected_depth_type != 0 || (0 < descriptor.min_stencil_size)))))) {
    std::__cxx11::string::assign((char *)&type_name);
  }
  else if ((descriptor.expected_alpha_type == 0x1404 || descriptor.expected_blue_type == 0x1404) ||
           (descriptor.expected_green_type == 0x1404 || descriptor.expected_red_type == 0x1404)) {
    std::__cxx11::string::assign((char *)&type_name);
  }
  else {
    std::__cxx11::string::assign((char *)&type_name);
  }
  std::__cxx11::string::assign((char *)&sampler_prefix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&template_verison,"#version 150",(allocator<char> *)&fragment_shader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragment_shader,s_fragment_shader_template,(allocator<char> *)&local_248);
  std::__cxx11::string::string((string *)&local_68,(string *)&fragment_shader);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"TEMPLATE_TYPE",&local_2a9)
  ;
  std::__cxx11::string::string((string *)&local_a8,(string *)&type_name);
  Utilities::preprocessString(&local_248,&local_68,&local_88,&local_a8);
  std::__cxx11::string::operator=((string *)&fragment_shader,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_c8,(string *)&fragment_shader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"TEMPLATE_SAMPLER",&local_2a9);
  psVar3 = (string *)std::__cxx11::string::append((string *)&sampler_prefix);
  std::__cxx11::string::string((string *)&local_108,psVar3);
  Utilities::preprocessString(&local_248,&local_c8,&local_e8,&local_108);
  std::__cxx11::string::operator=((string *)&fragment_shader,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_128,(string *)&fragment_shader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"TEMPLATE_TEXEL_FETCH_ARGUMENTS",&local_2a9);
  std::__cxx11::string::string((string *)&local_168,(string *)&texel_fetch_arguments_tail);
  Utilities::preprocessString(&local_248,&local_128,&local_148,&local_168);
  std::__cxx11::string::operator=((string *)&fragment_shader,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_188,(string *)&fragment_shader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"TEMPLATE_COMPONENT",&local_2a9);
  std::__cxx11::string::string((string *)&local_1c8,(string *)&component_name);
  Utilities::preprocessString(&local_248,&local_188,&local_1a8,&local_1c8);
  std::__cxx11::string::operator=((string *)&fragment_shader,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  GVar2 = Utilities::buildProgram
                    ((Functions *)CONCAT44(extraout_var,iVar1),
                     ((this->super_TestCase).m_context)->m_testCtx->m_log,s_vertex_shader_code,
                     fragment_shader._M_dataplus._M_p);
  if (GVar2 != 0) {
    std::__cxx11::string::~string((string *)&fragment_shader);
    std::__cxx11::string::~string((string *)&template_verison);
    std::__cxx11::string::~string((string *)&sampler_prefix);
    std::__cxx11::string::~string((string *)&type_name);
    std::__cxx11::string::~string((string *)&component_name);
    std::__cxx11::string::~string((string *)&texel_fetch_arguments_tail);
    std::__cxx11::string::~string((string *)&sampler_name);
    return GVar2;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

glw::GLuint FunctionalTest::prepareProgram(glw::GLenum target, TextureInternalFormatDescriptor descriptor,
										   ColorChannelSelector channel)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing sampler name and textelFetch arguments */
	std::string sampler_name			   = "";
	std::string texel_fetch_arguments_tail = "";

	switch (target)
	{
	case GL_TEXTURE_1D:
		sampler_name			   = "sampler1D";
		texel_fetch_arguments_tail = "0, 0";
		break;
	case GL_TEXTURE_2D:
		sampler_name			   = "sampler2D";
		texel_fetch_arguments_tail = "ivec2(0), 0";
		break;
	case GL_TEXTURE_1D_ARRAY:
		sampler_name			   = "sampler1DArray";
		texel_fetch_arguments_tail = "ivec2(0), 0";
		break;
	case GL_TEXTURE_RECTANGLE:
		sampler_name			   = "sampler2DRect";
		texel_fetch_arguments_tail = "ivec2(0)";
		break;
	case GL_TEXTURE_2D_ARRAY:
		sampler_name			   = "sampler2DArray";
		texel_fetch_arguments_tail = "ivec3(0), 0";
		break;
	case GL_TEXTURE_3D:
		sampler_name			   = "sampler3D";
		texel_fetch_arguments_tail = "ivec3(0), 0";
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
		sampler_name			   = "sampler2DMS";
		texel_fetch_arguments_tail = "ivec2(0), ";
		texel_fetch_arguments_tail.append(Utilities::itoa(m_max_samples - 1));
		break;
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		sampler_name			   = "sampler2DMSArray";
		texel_fetch_arguments_tail = "ivec3(0), ";
		texel_fetch_arguments_tail.append(Utilities::itoa(m_max_samples - 1));
		break;
	default:
		throw 0;
	}

	/* Preparing component selector name */
	std::string component_name = "";

	switch (channel)
	{
	case RED_COMPONENT:
		component_name = ".r";
		break;
	case GREEN_COMPONENT:
		component_name = ".g";
		break;
	case BLUE_COMPONENT:
		component_name = ".b";
		break;
	case ALPHA_COMPONENT:
		component_name = ".a";
		break;
	case COMPONENTS_COUNT:
		break;
	default:
		throw 0;
	}

	/* Preparing output type name and sampler prefix */
	std::string type_name	  = "";
	std::string sampler_prefix = "";

	if (isFloatType(descriptor) || isFixedSignedType(descriptor) || isFixedUnsignedType(descriptor) ||
		isDepthType(descriptor) || isStencilType(descriptor))
	{
		if (channel == COMPONENTS_COUNT)
		{
			type_name = "vec4";
		}
		else
		{
			type_name = "float";
		}
		sampler_prefix = "";
	}
	else
	{
		if (isIntegerSignedType(descriptor))
		{
			if (channel == COMPONENTS_COUNT)
			{
				type_name = "ivec4";
			}
			else
			{
				type_name = "int";
			}
			sampler_prefix = "i";
		}
		else
		{
			if (channel == COMPONENTS_COUNT)
			{
				type_name = "uvec4";
			}
			else
			{
				type_name = "uint";
			}
			sampler_prefix = "u";
		}
	}

	std::string template_verison = "#version 150";

	/* Preprocessing fragment shader source code. */
	std::string fragment_shader = s_fragment_shader_template;

	fragment_shader = Utilities::preprocessString(fragment_shader, "TEMPLATE_TYPE", type_name);
	fragment_shader =
		Utilities::preprocessString(fragment_shader, "TEMPLATE_SAMPLER", sampler_prefix.append(sampler_name));
	fragment_shader =
		Utilities::preprocessString(fragment_shader, "TEMPLATE_TEXEL_FETCH_ARGUMENTS", texel_fetch_arguments_tail);
	fragment_shader = Utilities::preprocessString(fragment_shader, "TEMPLATE_COMPONENT", component_name);

	/* Building program. */
	glw::GLuint program =
		Utilities::buildProgram(gl, m_context.getTestContext().getLog(), s_vertex_shader_code, fragment_shader.c_str());

	if (0 == program)
	{
		throw 0;
	}

	/* Return program name. */
	return program;
}